

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

char * SimpleString::StrStr(char *s1,char *s2)

{
  char cVar1;
  size_t n;
  long lVar2;
  long lVar3;
  
  if (*s2 != '\0') {
    cVar1 = *s1;
    while( true ) {
      if (cVar1 == '\0') {
        return (char *)0x0;
      }
      lVar2 = -1;
      do {
        lVar3 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (s2[lVar3] != '\0');
      if (lVar2 == 0) break;
      lVar3 = 0;
      while( true ) {
        cVar1 = s1[lVar3];
        if ((cVar1 == '\0') || (cVar1 != s2[lVar3])) break;
        lVar3 = lVar3 + 1;
        if (lVar2 == lVar3) {
          return s1;
        }
      }
      if (cVar1 == s2[lVar3]) {
        return s1;
      }
      cVar1 = s1[1];
      s1 = s1 + 1;
    }
  }
  return s1;
}

Assistant:

const char* SimpleString::StrStr(const char* s1, const char* s2)
{
    if(!*s2) return s1;
    for (; *s1; s1++)
        if (StrNCmp(s1, s2, StrLen(s2)) == 0)
            return s1;
    return NULLPTR;
}